

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_input_array_stride_msl
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool row_major;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t uVar1;
  SPIRType local_180;
  uint32_t local_1c;
  SPIRType *pSStack_18;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  local_1c = index;
  pSStack_18 = type;
  type_local = (SPIRType *)this;
  get_presumed_input_type(&local_180,this,type,index);
  id = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_18->super_IVariant).self);
  row_major = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)id.id,local_1c,DecorationRowMajor);
  uVar1 = get_declared_type_array_stride_msl(this,&local_180,false,row_major);
  SPIRType::~SPIRType(&local_180);
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::get_declared_input_array_stride_msl(const SPIRType &type, uint32_t index) const
{
	return get_declared_type_array_stride_msl(get_presumed_input_type(type, index), false,
	                                          has_member_decoration(type.self, index, DecorationRowMajor));
}